

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serving_request.cpp
# Opt level: O0

void __thiscall
foxxll::serving_request::serving_request
          (serving_request *this,completion_handler *on_cmpl,file *file,void *buffer,
          offset_type offset,size_type bytes,read_or_write op)

{
  bool bVar1;
  size_type bytes_local;
  offset_type offset_local;
  void *buffer_local;
  file *file_local;
  completion_handler *on_cmpl_local;
  serving_request *this_local;
  
  request_interface::request_interface((request_interface *)this);
  request_with_state::request_with_state
            (&this->super_request_with_state,&PTR_PTR_001e4d48,on_cmpl,file,buffer,offset,bytes,op);
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR_add_waiter_001e4ce0;
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR_add_waiter_001e4ce0;
  bVar1 = foxxll::file::need_alignment(file);
  if (bVar1) {
    request::check_alignment((request *)this);
  }
  return;
}

Assistant:

serving_request::serving_request(
    const completion_handler& on_cmpl,
    file* file, void* buffer, offset_type offset, size_type bytes,
    read_or_write op)
    : request_with_state(on_cmpl, file, buffer, offset, bytes, op)
{
#ifdef FOXXLL_CHECK_BLOCK_ALIGNING
    // Direct I/O requires file system block size alignment for file offsets,
    // memory buffer addresses, and transfer(buffer) size must be multiple
    // of the file system block size
    if (file->need_alignment())
        check_alignment();
#endif
}